

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler.cpp
# Opt level: O2

void __thiscall
r_comp::Decompiler::write_set
          (Decompiler *this,uint16_t read_index,bool aply_time_offset,uint16_t write_as_view_index)

{
  byte bVar1;
  uint16_t write_as_view_index_00;
  undefined6 in_register_0000000a;
  undefined6 in_register_00000032;
  undefined4 uVar2;
  ushort arity;
  ushort uVar3;
  uint uVar4;
  uint uVar5;
  bool bVar6;
  bool after_tail_wildcard;
  bool local_3a;
  char local_39 [5];
  undefined4 local_34;
  
  r_code::vector<r_code::Atom>::operator[]
            ((vector<r_code::Atom> *)(this->current_object + 8),
             CONCAT62(in_register_00000032,read_index) & 0xffffffff);
  bVar1 = r_code::Atom::getAtomCount();
  local_3a = false;
  if (bVar1 == 1) {
    local_39[4] = 0x5b;
    OutStream::push<char>(this->out_stream,local_39 + 4,read_index);
    write_any(this,read_index + 1,&local_3a,aply_time_offset,0);
    local_39[3] = 0x5d;
    OutStream::operator<<(this->out_stream,local_39 + 3);
  }
  else {
    arity = (ushort)bVar1;
    if (write_as_view_index == read_index && write_as_view_index != 0) {
      write_view(this,read_index,arity);
      return;
    }
    uVar5 = (uint)CONCAT62(in_register_00000032,read_index);
    local_34 = (undefined4)CONCAT62(in_register_0000000a,write_as_view_index);
    if (this->horizontal_set == true) {
      local_39[2] = 0x5b;
      OutStream::push<char>(this->out_stream,local_39 + 2,read_index);
      for (uVar3 = 0; arity != uVar3; uVar3 = uVar3 + 1) {
        if (uVar3 != 0) {
          local_39[0] = ' ';
          OutStream::operator<<(this->out_stream,local_39);
        }
        uVar2 = 0;
        if (local_3a == false) {
          uVar2 = local_34;
        }
        write_any(this,read_index + 1 + uVar3,&local_3a,aply_time_offset,(uint16_t)uVar2);
      }
      local_39[1] = 0x5d;
      OutStream::operator<<(this->out_stream,local_39 + 1);
      this->closing_set = true;
    }
    else {
      OutStream::push<char[3]>(this->out_stream,(char (*) [3])0x146c67,read_index);
      this->indents = this->indents + 3;
      while( true ) {
        uVar4 = uVar5 + 1;
        bVar6 = arity == 0;
        arity = arity - 1;
        if (bVar6) break;
        if (local_3a == false) {
          write_indent(this,this->indents);
          write_as_view_index_00 = write_as_view_index;
        }
        else {
          write_as_view_index_00 = 0;
        }
        uVar5 = uVar4 & 0xffff;
        write_any(this,(uint16_t)uVar4,&local_3a,aply_time_offset,write_as_view_index_00);
      }
      this->closing_set = true;
      this->indents = this->indents - 3;
    }
  }
  return;
}

Assistant:

void Decompiler::write_set(uint16_t read_index, bool aply_time_offset, uint16_t write_as_view_index)   // read_index points to a set atom.
{
    uint16_t arity = current_object->code[read_index].getAtomCount();
    bool after_tail_wildcard = false;

    if (arity == 1) { // write [element]
        out_stream->push('[', read_index);
        write_any(++read_index, after_tail_wildcard, aply_time_offset);
        *out_stream << ']';
    } else if (write_as_view_index > 0 && write_as_view_index == read_index) {
        write_view(read_index, arity);
    } else if (horizontal_set) { // write [elements].
        out_stream->push('[', read_index);

        for (uint16_t i = 0; i < arity; ++i) {
            if (i > 0) {
                *out_stream << ' ';
            }

            if (after_tail_wildcard) {
                write_any(++read_index, after_tail_wildcard, aply_time_offset);
            } else {
                write_any(++read_index, after_tail_wildcard, aply_time_offset, write_as_view_index);
            }
        }

        *out_stream << ']';
        closing_set = true;
    } else { // write []+indented elements.
        out_stream->push("[]", read_index);
        indents += 3;

        for (uint16_t i = 0; i < arity; ++i) {
            if (after_tail_wildcard) {
                write_any(++read_index, after_tail_wildcard, aply_time_offset);
            } else {
                write_indent(indents);
                write_any(++read_index, after_tail_wildcard, aply_time_offset, write_as_view_index);
            }
        }

        closing_set = true;
        indents -= 3; // don't call write_indents() here as the last set member can be a set.
    }
}